

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O2

Matrix6x6 * __thiscall
iDynTree::Transform::asAdjointTransformWrench(Matrix6x6 *__return_storage_ptr__,Transform *this)

{
  double *pdVar1;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  undefined1 local_c8 [28];
  uint uStack_ac;
  variable_if_dynamic<long,__1> local_a8;
  variable_if_dynamic<long,__1> vStack_a0;
  double local_98;
  undefined4 uStack_90;
  uint uStack_8c;
  undefined8 local_88;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
  local_80;
  undefined1 local_68 [32];
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> local_40;
  Index local_38;
  
  R.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&this->rot;
  local_a8.m_value = 0;
  vStack_a0.m_value = 0;
  local_98 = 2.96439387504748e-323;
  local_c8._0_8_ = __return_storage_ptr__;
  local_c8._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_c8,&R);
  local_c8._0_8_ = __return_storage_ptr__->m_data + 3;
  local_a8.m_value = 0;
  vStack_a0.m_value = 3;
  local_98 = 2.96439387504748e-323;
  local_c8._16_8_ = __return_storage_ptr__;
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>_>
             *)local_c8);
  vStack_a0.m_value = (long)(this->pos).super_Vector3.m_data[0];
  uStack_90 = (undefined4)vStack_a0.m_value;
  local_c8._0_8_ = (PointerType)0x0;
  uStack_8c = (uint)((ulong)vStack_a0.m_value >> 0x20) ^ 0x80000000;
  pdVar1 = (this->pos).super_Vector3.m_data + 1;
  local_98 = *pdVar1;
  local_c8._24_4_ = *(undefined4 *)((this->pos).super_Vector3.m_data + 2);
  uStack_ac = *(uint *)((long)(this->pos).super_Vector3.m_data + 0x14) ^ 0x80000000;
  local_c8._16_8_ = (ulong)*pdVar1 ^ 0x8000000000000000;
  local_a8.m_value = 0;
  local_88 = 0;
  local_80.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = R.
           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
  local_80.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _8_2_ = R.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._8_2_;
  local_68._0_8_ = __return_storage_ptr__->m_data + 0x12;
  local_48.m_value = 3;
  local_40.m_value = 0;
  local_38 = 6;
  local_80.m_lhs = (LhsNested)local_c8;
  local_68._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_68,&local_80);
  local_c8._0_8_ = __return_storage_ptr__->m_data + 0x15;
  local_a8.m_value = 3;
  vStack_a0.m_value = 3;
  local_98 = 2.96439387504748e-323;
  local_c8._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_c8,&R);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 Transform::asAdjointTransformWrench() const
    {
        Matrix6x6 ret;

        Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

        Eigen::Map<const Eigen::Vector3d> p(this->getPosition().data());
        Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(this->getRotation().data());

        retEigen.block<3,3>(0,0) = R;
        retEigen.block<3,3>(0,3).setZero();
        retEigen.block<3,3>(3,0) = mySkew(p)*R;
        retEigen.block<3,3>(3,3) = R;

        return ret;
    }